

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int grapg_5_3::m_bfs(m_graph g,int v)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  long lStack_20;
  
  (&visited)[v] = 1;
  lVar1 = -((ulong)(uint)g.vnum * 4 + 0xf & 0xfffffffffffffff0);
  iVar3 = 0;
  uVar4 = 0;
  if (0 < g.vnum) {
    uVar4 = (ulong)(uint)g.vnum;
  }
  *(undefined8 *)((long)&lStack_20 + lVar1) = 0xffffffffffffffff;
  lVar5 = *(long *)((long)&lStack_20 + lVar1);
  uVar7 = 0;
  do {
    iVar6 = (int)uVar7;
    if ((&visited)[iVar6] == 0) {
      (&visited)[iVar6] = 1;
      lVar8 = (long)iVar3;
      iVar3 = iVar3 + 1;
      *(int *)(&stack0xffffffffffffffe8 + lVar8 * 4 + lVar1 + -0x18 + 0x18) = iVar6;
      lVar5 = (long)(int)lVar5;
      while (iVar6 = (int)uVar7, lVar5 < iVar3) {
        uVar7 = (ulong)*(int *)(&stack0xffffffffffffffec + lVar5 * 4 + lVar1);
        lVar5 = lVar5 + 1;
        piVar9 = &visited;
        for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
          if ((g.arc[uVar7][uVar2] == 1) && (*piVar9 == 0)) {
            *piVar9 = 1;
            lVar8 = (long)iVar3;
            iVar3 = iVar3 + 1;
            *(int *)(&stack0xffffffffffffffe8 + lVar8 * 4 + lVar1 + -0x18 + 0x18) = (int)uVar2;
          }
          piVar9 = piVar9 + 1;
        }
      }
    }
    uVar7 = (ulong)(iVar6 + 1);
  } while( true );
}

Assistant:

int m_bfs(m_graph g, int v) {
        visited[v] = 1;
        //visit;
        int q[g.vnum];
        int f = -1, r = 0;
        for (int i = 0; i < g.vnum; i++) {
            if (visited[i] == 0) {
                visited[i] = 1;
                q[r++] = i;
                while (f < r) {
                    i = q[++f];
                    for (int j = 0; j < g.vnum; j++) {
                        if (g.arc[i][j] == 1 && visited[j] == 0) {
                            visited[j] = 1;
                            //visit
                            q[r++] = j;
                        }
                    }
                }
            }
        }
    }